

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

bool __thiscall cfd::core::AbstractTxIn::IsCoinBase(AbstractTxIn *this)

{
  uint uVar1;
  uint uVar2;
  bool local_91;
  undefined1 *__n;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar4;
  ByteData local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  undefined1 local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_txid;
  bool is_coinbase;
  AbstractTxIn *this_local;
  
  empty_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  __n = &local_31;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x42f4ab);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff87,
                      CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),(size_type)__n,
             (allocator_type *)this);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x42f4c8);
  uVar1 = this->vout_;
  uVar2 = ::std::numeric_limits<unsigned_int>::max();
  bVar4 = 0;
  bVar3 = 0;
  local_91 = false;
  if (uVar1 == uVar2) {
    Txid::GetData(&local_78,&this->txid_);
    bVar4 = 1;
    ByteData::GetBytes(&local_60,&local_78);
    bVar3 = 1;
    local_91 = ::std::operator==(&local_60,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  }
  if ((bVar3 & 1) != 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  if ((bVar4 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x42f577);
  }
  if (local_91 != false) {
    empty_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  bVar3 = empty_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return (bool)(bVar3 & 1);
}

Assistant:

bool AbstractTxIn::IsCoinBase() const {
  bool is_coinbase = false;
  std::vector<uint8_t> empty_txid(kByteData256Length);
  if ((vout_ == std::numeric_limits<uint32_t>::max()) &&
      (txid_.GetData().GetBytes() == empty_txid)) {
    is_coinbase = true;
  }
  return is_coinbase;
}